

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O0

bool __thiscall MotionTrajectory::AddConstantVel(MotionTrajectory *this,double pEnd,bool isInfinite)

{
  bool bVar1;
  ConstantVel *this_00;
  ConstantVel *local_30;
  MotionBase *motion;
  MotionBase *prevMotion;
  double dStack_18;
  bool isInfinite_local;
  double pEnd_local;
  MotionTrajectory *this_local;
  
  prevMotion._7_1_ = isInfinite;
  dStack_18 = pEnd;
  pEnd_local = (double)this;
  motion = GetLastMotion(this);
  this_00 = (ConstantVel *)operator_new(0x48);
  ConstantVel::ConstantVel(this_00,dStack_18,(bool)(prevMotion._7_1_ & 1),motion);
  local_30 = this_00;
  bVar1 = MotionBase::IsOK((MotionBase *)this_00);
  if (bVar1) {
    std::vector<MotionBase_*,_std::allocator<MotionBase_*>_>::push_back
              (&this->motionList,(value_type *)&local_30);
  }
  bVar1 = MotionBase::IsOK(&local_30->super_MotionBase);
  return bVar1;
}

Assistant:

bool MotionTrajectory::AddConstantVel(double pEnd, bool isInfinite)
{
    const MotionBase *prevMotion = GetLastMotion();
    MotionBase *motion = new ConstantVel(pEnd, isInfinite, prevMotion);
    if (motion->IsOK())
        motionList.push_back(motion);
    return motion->IsOK();
}